

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

TimeRepr * timerepr_from_usecs(TimeRepr *__return_storage_ptr__,int64_t usecs)

{
  undefined1 auVar1 [16];
  int iVar2;
  int64_t x;
  long lVar3;
  
  __return_storage_ptr__->days = (int32_t)(usecs / 86400000000);
  iVar2 = (int)((usecs % 86400000000) / 3600000000);
  __return_storage_ptr__->hours = iVar2;
  lVar3 = (long)iVar2 * -3600000000 + usecs % 86400000000;
  iVar2 = (int)(lVar3 / 60000000);
  lVar3 = (long)iVar2 * -60000000 + lVar3;
  __return_storage_ptr__->minutes = iVar2;
  iVar2 = (int)(lVar3 / 1000000);
  __return_storage_ptr__->seconds = iVar2;
  lVar3 = (long)iVar2 * -1000000 + lVar3;
  auVar1 = SEXT816(lVar3) * SEXT816(0x20c49ba5e353f7cf);
  iVar2 = (int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f);
  __return_storage_ptr__->milliseconds = iVar2;
  __return_storage_ptr__->microseconds = (int)lVar3 + iVar2 * -1000;
  return __return_storage_ptr__;
}

Assistant:

TimeRepr timerepr_from_usecs(int64_t usecs) {
    TimeRepr result = {0};

    int64_t x = usecs;

    result.days = x / NUM_USECS_IN_A_DAY;
    x -= result.days * NUM_USECS_IN_A_DAY;

    result.hours = x / NUM_USECS_IN_AN_HOUR;
    x -= result.hours * NUM_USECS_IN_AN_HOUR;

    result.minutes = x / NUM_USECS_IN_A_MINUTE;
    x -= result.minutes * NUM_USECS_IN_A_MINUTE;

    result.seconds = x / NUM_USECS_IN_A_SEC;
    x -= result.seconds * NUM_USECS_IN_A_SEC;

    result.milliseconds = x / NUM_USECS_IN_A_MSEC;
    x -= result.milliseconds * NUM_USECS_IN_A_MSEC;

    result.microseconds = x;

    return result;
}